

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::ComputeObjectFilenames
          (cmLocalUnixMakefileGenerator3 *this,
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mapping,cmGeneratorTarget *gt)

{
  _Base_ptr p_Var1;
  string sStack_48;
  
  for (p_Var1 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(mapping->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    cmLocalGenerator::GetObjectFileNameWithoutTarget
              (&sStack_48,&this->super_cmLocalGenerator,*(cmSourceFile **)(p_Var1 + 1),
               &gt->ObjectDirectory,(bool *)0x0);
    std::__cxx11::string::operator=((string *)&p_Var1[1]._M_parent,(string *)&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::ComputeObjectFilenames(
                        std::map<cmSourceFile const*, std::string>& mapping,
                        cmGeneratorTarget const* gt)
{
  for(std::map<cmSourceFile const*, std::string>::iterator
      si = mapping.begin(); si != mapping.end(); ++si)
    {
    cmSourceFile const* sf = si->first;
    si->second = this->GetObjectFileNameWithoutTarget(*sf,
                                                      gt->ObjectDirectory);
    }
}